

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgenPeeps.cpp
# Opt level: O0

bool __thiscall AgenPeeps::IsMemoryOpnd(AgenPeeps *this,Opnd *opnd)

{
  bool bVar1;
  undefined1 local_19;
  Opnd *opnd_local;
  AgenPeeps *this_local;
  
  bVar1 = IR::Opnd::IsSymOpnd(opnd);
  local_19 = true;
  if (!bVar1) {
    bVar1 = IR::Opnd::IsIndirOpnd(opnd);
    local_19 = true;
    if (!bVar1) {
      local_19 = IR::Opnd::IsMemRefOpnd(opnd);
    }
  }
  return local_19;
}

Assistant:

bool AgenPeeps::IsMemoryOpnd(IR::Opnd *opnd)
{
    return opnd->IsSymOpnd() || opnd->IsIndirOpnd() || opnd->IsMemRefOpnd();
}